

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall
kj::MainBuilder::MainBuilder
          (MainBuilder *this,ProcessContext *context,StringPtr version,StringPtr briefDescription,
          StringPtr extendedDescription)

{
  initializer_list<kj::MainBuilder::OptionName> names;
  StringPtr helpText;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  RefOrVoid<kj::MainBuilder::Impl> pIVar1;
  Type *func;
  Type *func_00;
  Type *constFunc;
  ArrayPtr<const_char> local_f8;
  undefined1 local_e2 [2];
  BoundMethod<kj::MainBuilder::Impl_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_main_c__:318:26),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_main_c__:318:26)>
  local_e0;
  Function<kj::MainBuilder::Validity_()> local_d0;
  OptionName local_c0;
  iterator local_b0;
  size_type local_a8;
  StringPtr local_a0;
  undefined1 local_8a [2];
  BoundMethod<kj::MainBuilder::Impl_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_main_c__:316:26),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_main_c__:316:26)>
  local_88;
  Function<kj::MainBuilder::Validity_()> local_78 [2];
  OptionName local_58;
  iterator local_48;
  size_type local_40;
  ProcessContext *local_38;
  ProcessContext *context_local;
  MainBuilder *this_local;
  StringPtr briefDescription_local;
  StringPtr version_local;
  
  briefDescription_local.content.ptr = (char *)briefDescription.content.size_;
  this_local = (MainBuilder *)briefDescription.content.ptr;
  briefDescription_local.content.size_ = (size_t)version.content.ptr;
  constFunc = (Type *)&extendedDescription;
  func = (Type *)&this_local;
  local_38 = context;
  context_local = (ProcessContext *)this;
  heap<kj::MainBuilder::Impl,kj::ProcessContext&,kj::StringPtr&,kj::StringPtr&,kj::StringPtr&>
            ((kj *)this,context,(StringPtr *)&briefDescription_local.content.size_,(StringPtr *)func
             ,(StringPtr *)constFunc);
  OptionName::OptionName(&local_58,"verbose");
  local_48 = &local_58;
  local_40 = 1;
  pIVar1 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator*(&this->impl);
  local_88.t = (Impl *)kj::_::
                       boundMethod<kj::MainBuilder::Impl&,kj::MainBuilder::Impl(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::__0,kj::MainBuilder::__0(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::__1>
                                 ((BoundMethod<kj::MainBuilder::Impl_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_main_c__:316:26),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_main_c__:316:26)>
                                   *)pIVar1,(_ *)(local_8a + 1),(Impl *)local_8a,func,constFunc);
  Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<kj::MainBuilder::Impl&,kj::MainBuilder::Impl(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::__0,kj::MainBuilder::__0(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::__1>>
            ((Function<kj::MainBuilder::Validity()> *)local_78,&local_88);
  StringPtr::StringPtr(&local_a0,"Log informational messages to stderr; useful for debugging.");
  names_00._M_len = local_40;
  names_00._M_array = local_48;
  helpText.content.size_ = local_a0.content.size_;
  helpText.content.ptr = local_a0.content.ptr;
  func_00 = (Type *)local_78;
  addOption(this,names_00,(Function<kj::MainBuilder::Validity_()> *)func_00,helpText);
  Function<kj::MainBuilder::Validity_()>::~Function(local_78);
  OptionName::OptionName(&local_c0,"version");
  local_b0 = &local_c0;
  local_a8 = 1;
  pIVar1 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator*(&this->impl);
  local_e0.t = (Impl *)kj::_::
                       boundMethod<kj::MainBuilder::Impl&,kj::MainBuilder::Impl(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::__2,kj::MainBuilder::__2(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::__3>
                                 ((BoundMethod<kj::MainBuilder::Impl_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_main_c__:318:26),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_main_c__:318:26)>
                                   *)pIVar1,(_ *)(local_e2 + 1),(Impl *)local_e2,func_00,
                                  (Type *)local_a0.content.ptr);
  Function<kj::MainBuilder::Validity()>::
  Function<kj::_::BoundMethod<kj::MainBuilder::Impl&,kj::MainBuilder::Impl(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::__2,kj::MainBuilder::__2(kj::ProcessContext&,kj::StringPtr,kj::StringPtr,kj::StringPtr)::__3>>
            ((Function<kj::MainBuilder::Validity()> *)&local_d0,&local_e0);
  StringPtr::StringPtr((StringPtr *)&local_f8,"Print version information and exit.");
  names._M_len = local_a8;
  names._M_array = local_b0;
  addOption(this,names,&local_d0,(StringPtr)local_f8);
  Function<kj::MainBuilder::Validity_()>::~Function(&local_d0);
  return;
}

Assistant:

MainBuilder::MainBuilder(ProcessContext& context, StringPtr version,
                         StringPtr briefDescription, StringPtr extendedDescription)
    : impl(heap<Impl>(context, version, briefDescription, extendedDescription)) {
  addOption({"verbose"}, KJ_BIND_METHOD(*impl, increaseVerbosity),
            "Log informational messages to stderr; useful for debugging.");
  addOption({"version"}, KJ_BIND_METHOD(*impl, printVersion),
            "Print version information and exit.");
}